

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

Amount __thiscall
cfd::api::TransactionApi::EstimateFee
          (TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *txout_fee,
          Amount *utxo_fee,double effective_fee_rate)

{
  Address *this_00;
  long lVar1;
  AddressType AVar2;
  bool bVar3;
  uint32_t no_witness_size;
  uint32_t size;
  uint32_t size_00;
  uint uVar4;
  undefined8 extraout_RDX;
  NetType type;
  uint32_t uVar5;
  Script *pSVar6;
  AddressType addr_type;
  pointer pUVar7;
  double dVar8;
  Amount AVar9;
  FeeCalculator fee_calc;
  uint32_t nowit_size;
  uint32_t wit_size;
  AddressFactory_conflict address_factory;
  string descriptor;
  Script redeem_script;
  TransactionContext txc;
  DescriptorScriptData data;
  uint32_t local_538;
  FeeCalculator local_534;
  uint32_t local_530;
  uint local_52c;
  uint32_t local_528;
  uint32_t local_524;
  int64_t local_520;
  double local_518;
  Amount local_510;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_500;
  Amount *local_4f8;
  Amount *local_4f0;
  pointer local_4e8;
  undefined1 local_4e0 [40];
  string local_4b8;
  undefined1 local_498 [56];
  int64_t local_460;
  Script local_458;
  TransactionContext local_420;
  undefined1 local_368 [448];
  AddressType local_1a8;
  Script local_1a0 [6];
  
  local_518 = effective_fee_rate;
  local_4f8 = txout_fee;
  local_4f0 = utxo_fee;
  TransactionContext::TransactionContext(&local_420,tx_hex);
  local_524 = 0;
  local_528 = 0;
  pUVar7 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_4e8 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_52c = 0;
  local_530 = 0;
  local_538 = 0;
  local_500 = utxos;
  for (; uVar5 = local_530, pUVar7 != local_4e8; pUVar7 = pUVar7 + 1) {
    this_00 = &pUVar7->address;
    core::Address::GetAddress_abi_cxx11_((string *)local_368,this_00);
    lVar1 = CONCAT44(local_368._12_4_,local_368._8_4_);
    std::__cxx11::string::~string((string *)local_368);
    if (lVar1 == 0) {
      type = kMainnet;
    }
    else {
      type = this_00->type_;
    }
    AddressFactory::AddressFactory((AddressFactory *)local_4e0,type);
    std::__cxx11::string::string((string *)&local_4b8,(string *)&pUVar7->descriptor);
    std::__cxx11::string::string((string *)local_498,"",(allocator *)&local_520);
    AddressFactory::ParseOutputDescriptor
              ((DescriptorScriptData *)local_368,(AddressFactory *)local_4e0,&local_4b8,
               (string *)local_498,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
    std::__cxx11::string::~string((string *)local_498);
    core::Address::GetAddress_abi_cxx11_((string *)local_498,this_00);
    AVar2 = local_1a8;
    if (local_1a8 == kP2shP2wpkhAddress || CONCAT71(local_498._9_7_,local_498[8]) == 0) {
      std::__cxx11::string::~string((string *)local_498);
      addr_type = local_1a8;
    }
    else {
      std::__cxx11::string::~string((string *)local_498);
      addr_type = local_1a8;
      if (AVar2 != kP2shP2wshAddress) {
        addr_type = (pUVar7->address).addr_type_;
      }
    }
    core::Script::Script((Script *)local_498);
    pSVar6 = &pUVar7->redeem_script;
    bVar3 = core::Script::IsEmpty(pSVar6);
    if (bVar3) {
      bVar3 = core::Script::IsEmpty(local_1a0);
      if (!bVar3) {
        pSVar6 = local_1a0;
      }
    }
    core::Script::operator=((Script *)local_498,pSVar6);
    bVar3 = core::Script::IsEmpty((Script *)local_498);
    if (bVar3 && addr_type != kTaprootAddress) {
      pSVar6 = (Script *)0x0;
    }
    else {
      pSVar6 = &pUVar7->scriptsig_template;
      bVar3 = core::Script::IsEmpty(pSVar6);
      if (bVar3) {
        pSVar6 = (Script *)0x0;
      }
    }
    core::Script::Script(&local_458,(Script *)local_498);
    core::TxIn::EstimateTxInSize(addr_type,&local_458,&local_524,&local_528,pSVar6);
    core::Script::~Script(&local_458);
    local_538 = local_538 + local_528;
    local_530 = local_530 + local_524;
    local_52c = local_52c + (local_524 == 0);
    core::Script::~Script((Script *)local_498);
    DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_368);
    std::__cxx11::string::~string((string *)&local_4b8);
    AddressFactory::~AddressFactory((AddressFactory *)local_4e0);
  }
  no_witness_size = TransactionContext::GetSizeIgnoreTxIn(&local_420,local_530 != 0);
  size = core::AbstractTransaction::GetVsizeFromSize(no_witness_size,0);
  if (local_52c != 0 && uVar5 != 0) {
    uVar4 = 0;
    if (local_52c <
        (uint)(((long)(local_500->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_500->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x4f0)) {
      uVar4 = local_52c;
    }
    uVar5 = uVar5 + uVar4;
  }
  size_00 = core::AbstractTransaction::GetVsizeFromSize(local_538,uVar5);
  dVar8 = floor(local_518 * 1000.0);
  FeeCalculator::FeeCalculator
            (&local_534,(long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8);
  AVar9 = FeeCalculator::GetFee(&local_534,size);
  local_498._0_8_ = AVar9.amount_;
  local_498[8] = AVar9.ignore_check_;
  AVar9 = FeeCalculator::GetFee(&local_534,size_00);
  local_4e0._0_8_ = AVar9.amount_;
  local_4e0[8] = AVar9.ignore_check_;
  uVar5 = core::AbstractTransaction::GetVsizeFromSize(no_witness_size + local_538,uVar5);
  AVar9 = FeeCalculator::GetFee(&local_534,uVar5);
  local_510.amount_ = AVar9.amount_;
  local_510.ignore_check_ = AVar9.ignore_check_;
  if (local_4f8 != (Amount *)0x0) {
    local_4f8->ignore_check_ = local_498[8];
    local_4f8->amount_ = local_498._0_8_;
  }
  if (local_4f0 != (Amount *)0x0) {
    local_4f0->ignore_check_ = local_4e0[8];
    local_4f0->amount_ = local_4e0._0_8_;
  }
  local_368._0_8_ = "cfdapi_transaction.cpp";
  local_368._8_4_ = 0x121;
  local_368._16_8_ = (long)"CfdInitializeEstimateFee" + 0xd;
  local_4b8._M_dataplus._M_p = (pointer)core::Amount::GetSatoshiValue(&local_510);
  local_520 = core::Amount::GetSatoshiValue((Amount *)local_498);
  local_460 = core::Amount::GetSatoshiValue((Amount *)local_4e0);
  core::logger::info<double&,long,long,long>
            ((CfdSourceLocation *)local_368,"EstimateFee rate={} fee={} tx={} utxo={}",&local_518,
             (long *)&local_4b8,&local_520,&local_460);
  TransactionContext::~TransactionContext(&local_420);
  AVar9._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar9.ignore_check_ = local_510.ignore_check_;
  AVar9.amount_ = local_510.amount_;
  return AVar9;
}

Assistant:

Amount TransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    Amount* txout_fee, Amount* utxo_fee, double effective_fee_rate) const {
  TransactionContext txc(tx_hex);

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t nowit_size = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kMainnet;
    if (!utxo.address.GetAddress().empty()) {
      net_type = utxo.address.GetNetType();
    }
    AddressFactory address_factory(net_type);
    // check descriptor
    std::string descriptor = utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = address_factory.ParseOutputDescriptor(descriptor);

    AddressType addr_type;
    if (utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if (((!redeem_script.IsEmpty()) ||
         (addr_type == AddressType::kTaprootAddress)) &&
        (!utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.scriptsig_template;
    }

    TxIn::EstimateTxInSize(
        addr_type, redeem_script, &wit_size, &nowit_size, scriptsig_template);
    size += nowit_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }

  uint32_t tx_size = txc.GetSizeIgnoreTxIn((witness_size != 0));
  uint32_t tx_vsize = AbstractTransaction::GetVsizeFromSize(tx_size, 0);

  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint64_t fee_rate = static_cast<uint64_t>(floor(effective_fee_rate * 1000));
  FeeCalculator fee_calc(fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_size = tx_size + size;
  uint32_t total_vsize =
      AbstractTransaction::GetVsizeFromSize(total_size, witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}